

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressor.cpp
# Opt level: O0

int Imf_3_2::numLinesInBuffer(Compression comp)

{
  ArgExc *this;
  undefined4 in_EDI;
  int local_4;
  
  switch(in_EDI) {
  case 0:
  case 1:
  case 2:
    local_4 = 1;
    break;
  case 3:
    local_4 = 0x10;
    break;
  case 4:
    local_4 = 0x20;
    break;
  case 5:
    local_4 = 0x10;
    break;
  case 6:
  case 7:
  case 8:
    local_4 = 0x20;
    break;
  case 9:
    local_4 = 0x100;
    break;
  default:
    this = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(this,"Unknown compression type");
    __cxa_throw(this,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  return local_4;
}

Assistant:

int
numLinesInBuffer (Compression comp)
{
    switch (comp)
    {
        case NO_COMPRESSION:
        case RLE_COMPRESSION:
        case ZIPS_COMPRESSION: return 1;
        case ZIP_COMPRESSION: return 16;
        case PIZ_COMPRESSION: return 32;
        case PXR24_COMPRESSION: return 16;
        case B44_COMPRESSION:
        case B44A_COMPRESSION:
        case DWAA_COMPRESSION: return 32;
        case DWAB_COMPRESSION: return 256;

        default: throw IEX_NAMESPACE::ArgExc ("Unknown compression type");
    }
}